

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QHostInfoRunnable_*>::begin(QList<QHostInfoRunnable_*> *this)

{
  QHostInfoRunnable **n;
  QArrayDataPointer<QHostInfoRunnable_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QHostInfoRunnable_*> *)0x222329);
  QArrayDataPointer<QHostInfoRunnable_*>::operator->(in_RDI);
  n = QArrayDataPointer<QHostInfoRunnable_*>::begin
                ((QArrayDataPointer<QHostInfoRunnable_*> *)0x22233a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }